

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_thread.c
# Opt level: O0

QcThreadKey * qc_thread_key_create(void)

{
  int iVar1;
  QcThreadKey *threadkey;
  
  threadkey = (QcThreadKey *)malloc(4);
  if (threadkey != (QcThreadKey *)0x0) {
    memset(threadkey,0,4);
    if (threadkey == (QcThreadKey *)0x0) {
      threadkey = (QcThreadKey *)0x0;
    }
    else {
      iVar1 = pthread_key_create((pthread_key_t *)threadkey,(__destr_function *)0x0);
      if (iVar1 != 0) {
        _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_thread.c"
                  ,0x8e,"threadkey create failed");
        free(threadkey);
        threadkey = (QcThreadKey *)0x0;
      }
    }
    return threadkey;
  }
  fprintf(_stderr,"malloc failed. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_thread.c"
          ,0x86);
  __assert_fail("threadkey",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_thread.c"
                ,0x86,"QcThreadKey *qc_thread_key_create()");
}

Assistant:

QcThreadKey* qc_thread_key_create()
{
    QcThreadKey *threadkey;

    qc_malloc(threadkey, sizeof(QcThreadKey));
    if(NULL == threadkey)
    {
        return NULL;
    }

    if(0 != pthread_key_create(&threadkey->key_t, NULL))
    {
        qc_error("threadkey create failed");
        qc_free(threadkey);
        return NULL;
    }

    return threadkey;
}